

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,TexelBufferComputeInstance *this)

{
  ulong uVar1;
  deUint32 *pdVar2;
  ShaderInputInterface SVar3;
  Allocation *pAVar4;
  ImmutableSamplerInfo *pIVar5;
  void *pvVar6;
  pointer pVVar7;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  VkFormat value;
  DescriptorUpdateMethod DVar10;
  uint uVar11;
  size_t sVar12;
  ostream *this_00;
  DescriptorPoolBuilder *pDVar13;
  pointer rawUpdateData;
  ulong uVar14;
  VkDescriptorUpdateTemplateKHR updateTemplate;
  bool bVar15;
  int resultNdx;
  char *pcVar16;
  long lVar17;
  TexelBufferComputeInstance *pTVar18;
  TestStatus *pTVar19;
  deUint32 dVar20;
  int iVar21;
  VkDescriptorSetLayout *descriptorSetLayouts;
  bool bVar22;
  TexelBufferComputeInstance *pTVar23;
  ulong uVar24;
  int *piVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vec4 result;
  VkDescriptorSetAllocateInfo allocInfo;
  ostringstream msg;
  Vec4 reference;
  VkDescriptorSet descriptorSets [1];
  Vec4 results [4];
  undefined1 auStack_478 [8];
  TexelBufferComputeInstance *local_470;
  ImmutableSamplerInfo local_468;
  ImmutableSamplerInfo IStack_460;
  pointer local_458;
  TestStatus *local_450;
  undefined1 local_448 [8];
  undefined1 auStack_440 [16];
  VkPipelineLayout VStack_430;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  ImmutableSamplerInfo local_408;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_400;
  pointer local_3e8;
  DeviceInterface *pDStack_3e0;
  VkDevice local_3d8;
  VkAllocationCallbacks *pVStack_3d0;
  VkDescriptorPool local_3c8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3c0;
  undefined1 local_3a8 [8];
  ImmutableSamplerInfo IStack_3a0;
  ImmutableSamplerInfo local_398;
  deUint32 dStack_390;
  VkShaderStageFlags VStack_38c;
  ImmutableSamplerInfo *local_388;
  pointer local_380;
  pointer local_378;
  pointer local_368;
  ios_base local_330 [264];
  ComputeCommand local_228;
  ios_base local_1b8 [272];
  undefined1 local_a8 [24];
  VkDescriptorSet local_90;
  ImmutableSamplerInfo local_88 [11];
  
  local_470 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,"Fetching 4 values from image in compute shader.\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,"Single descriptor set. Descriptor set contains ",0x2f);
  SVar3 = local_470->m_shaderInterface;
  if (SVar3 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar16 = "single";
LAB_00541fa5:
    sVar12 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar16,sVar12);
  }
  else {
    if (SVar3 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
      pcVar16 = "an array (size 2) of";
      goto LAB_00541fa5;
    }
    if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pcVar16 = "two";
      goto LAB_00541fa5;
    }
    std::ios::clear((int)auStack_478 +
                    (int)((DeviceInterface *)((long)local_228.m_vki - 0x18))->_vptr_DeviceInterface
                    + 0x250);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228," descriptor(s) of type ",0x17);
  pcVar16 = ::vk::getDescriptorTypeName(local_470->m_descriptorType);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)auStack_478 +
                    (int)((DeviceInterface *)((long)local_228.m_vki - 0x18))->_vptr_DeviceInterface
                    + 0x250);
  }
  else {
    sVar12 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar16,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,"Buffer view is created with a ",0x1e);
  pcVar16 = "View offset is zero, dynamic offset is zero";
  if (local_470->m_nonzeroViewOffset != false) {
    pcVar16 = "View offset is zero, dynamic offset is non-zero";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,pcVar16 + 0x27,(ulong)local_470->m_nonzeroViewOffset * 4 + 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228," offset.\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Buffer format is ",0x11)
  ;
  value = ::vk::mapTextureFormat(&(local_470->m_texelBuffers).m_imageFormat);
  pcVar16 = ::vk::getFormatName(value);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)auStack_478 +
                    (int)((DeviceInterface *)((long)local_228.m_vki - 0x18))->_vptr_DeviceInterface
                    + 0x250);
  }
  else {
    sVar12 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar16,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,".\n",2);
  piVar25 = &BindingModel::(anonymous_namespace)::TexelBufferInstanceBuffers::getFetchPos(int)::
             fetchPositions;
  lVar17 = 0;
  local_450 = __return_storage_ptr__;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Test sample ",0xc);
    this_00 = (ostream *)std::ostream::operator<<(&local_228,(uint)lVar17);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,": fetch at position ",0x14);
    std::ostream::operator<<(this_00,*piVar25);
    if (local_470->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228," from texelBuffer ",0x12);
      std::ostream::operator<<(&local_228,(uint)lVar17 & 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\n",1);
    lVar17 = lVar17 + 1;
    piVar25 = piVar25 + 1;
  } while (lVar17 != 4);
  local_3a8 = (undefined1  [8])((local_470->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_3a0);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&IStack_3a0,(char *)local_448,auStack_440._0_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
    operator_delete((void *)local_448,(ulong)(auStack_440._8_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_3a0);
  std::ios_base::~ios_base(local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
  std::ios_base::~ios_base(local_1b8);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_3a8);
  pTVar23 = local_470;
  DVar10 = local_470->m_updateMethod;
  dVar20 = 1;
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_3a8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
             (VkSampler *)0x0);
  SVar3 = pTVar23->m_shaderInterface;
  if (SVar3 != SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pTVar23 = local_470;
    if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      dVar20 = 1;
      ::vk::DescriptorSetLayoutBuilder::addBinding
                ((DescriptorSetLayoutBuilder *)local_3a8,local_470->m_descriptorType,1,0x20,
                 (VkSampler *)0x0);
    }
    else {
      if (SVar3 != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_00542368;
      dVar20 = 2;
    }
  }
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_3a8,pTVar23->m_descriptorType,dVar20,0x20,
             (VkSampler *)0x0);
LAB_00542368:
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_228,
             (DescriptorSetLayoutBuilder *)local_3a8,pTVar23->m_vki,pTVar23->m_device,
             (uint)((DVar10 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
                   DESCRIPTOR_UPDATE_METHOD_WITH_PUSH));
  if (local_378 != (pointer)0x0) {
    operator_delete(local_378,(long)local_368 - (long)local_378);
  }
  pvVar6 = (void *)CONCAT44(VStack_38c,dStack_390);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_380 - (long)pvVar6);
  }
  if (local_3a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3a8,(long)local_398 - (long)local_3a8);
  }
  local_408 = (ImmutableSamplerInfo)local_228.m_vki;
  DStack_400.m_deviceIface = (DeviceInterface *)local_228.m_device;
  DStack_400.m_device = (VkDevice)local_228.m_pipeline.m_internal;
  DStack_400.m_allocator = (VkAllocationCallbacks *)local_228.m_pipelineLayout.m_internal;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_228);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_228,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  dVar20 = 0;
  if ((ulong)local_470->m_shaderInterface < 4) {
    dVar20 = *(deUint32 *)(&DAT_00aec5b0 + (ulong)local_470->m_shaderInterface * 4);
  }
  pDVar13 = ::vk::DescriptorPoolBuilder::addType(pDVar13,local_470->m_descriptorType,dVar20);
  descriptorSetLayouts = (VkDescriptorSetLayout *)&DAT_00000001;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_3a8,pDVar13,local_470->m_vki,
             local_470->m_device,1,1);
  if ((ImmutableSamplerInfo)local_228.m_vki != (ImmutableSamplerInfo)0x0) {
    operator_delete(local_228.m_vki,local_228.m_pipeline.m_internal - (long)local_228.m_vki);
  }
  auVar8 = local_3a8;
  pTVar23 = local_470;
  local_3c8.m_internal = (deUint64)local_3a8;
  DStack_3c0.m_deviceIface = (DeviceInterface *)IStack_3a0;
  DStack_3c0.m_device = (VkDevice)local_398;
  local_388 = local_88;
  local_88[0] = local_408;
  local_3a8._0_4_ = 0x22;
  auVar9 = local_3a8;
  IStack_3a0.bindingIndex = 0;
  IStack_3a0.samplerBaseIndex = 0;
  local_3a8._0_4_ = auVar8._0_4_;
  local_3a8._4_4_ = auVar8._4_4_;
  local_398.bindingIndex = local_3a8._0_4_;
  local_398.samplerBaseIndex = local_3a8._4_4_;
  dStack_390 = 1;
  _local_448 = (undefined1  [16])0x0;
  stack0xfffffffffffffbc8 = (undefined1  [16])0x0;
  DVar10 = local_470->m_updateMethod;
  local_3a8 = auVar9;
  if ((DVar10 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_228,local_470->m_vki,
               local_470->m_device,(VkDescriptorSetAllocateInfo *)local_3a8);
    VStack_430.m_internal = local_228.m_pipelineLayout.m_internal;
    auStack_440._8_8_ = local_228.m_pipeline.m_internal;
    auStack_440._0_8_ = local_228.m_device;
    local_448 = (undefined1  [8])local_228.m_vki;
    DVar10 = pTVar23->m_updateMethod;
  }
  pTVar23 = local_470;
  if (DVar10 == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    writeDescriptorSet(local_470,(VkDescriptorSet)local_448);
  }
  else if (DVar10 == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
    writeDescriptorSetWithTemplate
              (local_470,(VkDescriptorSet)local_448,(VkDescriptorSetLayout)local_88[0],false,
               (VkPipelineLayout)0x0);
  }
  local_3e8 = (pointer)local_448;
  pDStack_3e0 = (DeviceInterface *)auStack_440._0_8_;
  local_3d8 = (VkDevice)auStack_440._8_8_;
  pVStack_3d0 = (VkAllocationCallbacks *)VStack_430.m_internal;
  ComputePipeline::ComputePipeline
            ((ComputePipeline *)local_448,pTVar23->m_vki,pTVar23->m_device,
             ((pTVar23->super_TestInstance).m_context)->m_progCollection,(deUint32)&local_408,
             descriptorSetLayouts);
  pVVar7 = local_3e8;
  pTVar18 = local_470;
  local_228.m_descriptorSets = &local_90;
  local_90.m_internal = (deUint64)local_3e8;
  DVar10 = pTVar23->m_updateMethod;
  local_228.m_numPreBarriers = (pTVar23->m_texelBuffers).m_numTexelBuffers;
  local_228.m_vki = pTVar23->m_vki;
  local_228.m_device = pTVar23->m_device;
  local_228.m_pipeline.m_internal = local_428._0_8_;
  local_228.m_pipelineLayout.m_internal = (deUint64)local_448;
  local_228.m_numWorkGroups.m_data[0] = 4;
  local_228.m_numWorkGroups.m_data[1] = 1;
  local_228.m_numWorkGroups.m_data[2] = 1;
  local_228.m_preBarriers = (pTVar23->m_texelBuffers).m_bufferBarriers;
  local_228.m_postBarriers = &(pTVar23->m_result).m_bufferBarrier;
  local_228.m_numDescriptorSets = (int)(DVar10 - DESCRIPTOR_UPDATE_METHOD_LAST < 0xfffffffe);
  local_228.m_numDynamicOffsets = 0;
  local_228.m_dynamicOffsets = (deUint32 *)0x0;
  local_228.m_numPostBarriers = 1;
  if (DVar10 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    writeDescriptorSet(local_470,(VkDescriptorSet)0x0);
    ComputeCommand::submitAndWait
              (&local_228,pTVar18->m_queueFamilyIndex,pTVar18->m_queue,&pTVar18->m_updateBuilder);
  }
  else {
    updateTemplate.m_internal = 0;
    rawUpdateData = (pointer)0x0;
    if (DVar10 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      writeDescriptorSetWithTemplate
                (local_470,(VkDescriptorSet)0x0,(VkDescriptorSetLayout)local_408,true,
                 (VkPipelineLayout)local_448);
      updateTemplate.m_internal =
           (pTVar18->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal;
      rawUpdateData =
           (pTVar18->m_updateRegistry).m_updateEntries.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    pTVar18 = local_470;
    ComputeCommand::submitAndWait
              (&local_228,local_470->m_queueFamilyIndex,local_470->m_queue,updateTemplate,
               rawUpdateData);
  }
  pAVar4 = (pTVar18->m_result).m_bufferMem.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            ((pTVar18->m_result).m_vki,(pTVar18->m_result).m_device,
             (VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,0x40);
  local_458 = pVVar7;
  pIVar5 = (ImmutableSamplerInfo *)
           ((pTVar18->m_result).m_bufferMem.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  local_88[6] = pIVar5[6];
  local_88[7] = pIVar5[7];
  local_88[4] = pIVar5[4];
  local_88[5] = pIVar5[5];
  local_88[2] = pIVar5[2];
  local_88[3] = pIVar5[3];
  local_88[0] = *pIVar5;
  local_88[1] = pIVar5[1];
  bVar15 = true;
  uVar24 = 0;
  bVar22 = false;
LAB_00542783:
  do {
    local_468 = local_88[uVar24 * 2];
    IStack_460 = local_88[uVar24 * 2 + 1];
    iVar21 = 0x58;
    if ((pTVar18->m_texelBuffers).m_numTexelBuffers == 1) {
      iVar21 = 0x30;
    }
    if ((uVar24 & 1) == 0) {
      iVar21 = 0x30;
    }
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)local_a8,iVar21 + (int)&pTVar18->m_texelBuffers,
               (&BindingModel::(anonymous_namespace)::TexelBufferInstanceBuffers::getFetchPos(int)::
                 fetchPositions)[uVar24],0);
    pTVar19 = local_450;
    local_3a8 = (undefined1  [8])0xbf800000bf800000;
    IStack_3a0.bindingIndex = 0xbf800000;
    IStack_3a0.samplerBaseIndex = 0xbf800000;
    if (((float)local_468.bindingIndex != -1.0) || (NAN((float)local_468.bindingIndex))) {
LAB_005427e7:
      bVar22 = true;
    }
    else {
      uVar14 = 0xffffffffffffffff;
      do {
        if (uVar14 == 2) goto LAB_005427ea;
        lVar17 = uVar14 + 2;
        uVar1 = uVar14 + 1;
        pdVar2 = &IStack_3a0.bindingIndex + uVar14;
      } while (((float)(&local_468.bindingIndex)[lVar17] == (float)*pdVar2) &&
              (uVar14 = uVar1,
              !NAN((float)(&local_468.bindingIndex)[lVar17]) && !NAN((float)*pdVar2)));
      if (uVar1 < 3) goto LAB_005427e7;
    }
LAB_005427ea:
    auVar28._0_4_ = (float)local_468.bindingIndex - (float)local_a8._0_4_;
    auVar28._4_4_ = (float)local_468.samplerBaseIndex - (float)local_a8._4_4_;
    auVar28._8_4_ = (float)IStack_460.bindingIndex - (float)local_a8._8_4_;
    auVar28._12_4_ = (float)IStack_460.samplerBaseIndex - (float)local_a8._12_4_;
    uVar14 = CONCAT44(auVar28._4_4_,auVar28._0_4_);
    auVar27._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar27._8_4_ = -auVar28._8_4_;
    auVar27._12_4_ = -auVar28._12_4_;
    auVar28 = maxps(auVar27,auVar28);
    auVar26._4_4_ = -(uint)(0.003921569 < auVar28._4_4_);
    auVar26._0_4_ = -(uint)(0.003921569 < auVar28._0_4_);
    auVar26._8_4_ = -(uint)(0.003921569 < auVar28._8_4_);
    auVar26._12_4_ = -(uint)(0.003921569 < auVar28._12_4_);
    auVar28 = packssdw(auVar26,auVar26);
    auVar28 = packsswb(auVar28,auVar28);
    uVar11 = SUB164(auVar28 & _DAT_00ac4030,0);
    if ((((SUB161(auVar28 & _DAT_00ac4030,0) != '\0') || ((uVar11 >> 8 & 1) != 0)) ||
        ((uVar11 >> 0x10 & 1) != 0)) || ((uVar11 >> 0x18 & 1) != 0)) {
      local_3a8 = (undefined1  [8])((local_470->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_3a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_3a0,"Test sample ",0xc);
      std::ostream::operator<<(&IStack_3a0,(int)uVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_3a0,": Expected ",0xb);
      tcu::operator<<((ostream *)&IStack_3a0,(Vector<float,_4> *)local_a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_3a0,", got ",6);
      tcu::operator<<((ostream *)&IStack_3a0,(Vector<float,_4> *)&local_468);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_3a0);
      std::ios_base::~ios_base(local_330);
      uVar24 = uVar24 + 1;
      bVar15 = false;
      if (uVar24 == 4) goto LAB_00542997;
      goto LAB_00542783;
    }
    uVar24 = uVar24 + 1;
    if (uVar24 == 4) {
      if (bVar15) {
        local_3a8 = (undefined1  [8])&local_398;
        IStack_3a0.bindingIndex = 4;
        IStack_3a0.samplerBaseIndex = 0;
        local_398._0_5_ = 0x73736150;
        local_450->m_code = QP_TEST_RESULT_PASS;
        (local_450->m_description)._M_dataplus._M_p = (pointer)&(local_450->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_450->m_description,local_3a8);
      }
      else {
LAB_00542997:
        if (bVar22) {
          local_3a8 = (undefined1  [8])&local_398;
          local_468.bindingIndex = 0x15;
          local_468.samplerBaseIndex = 0;
          local_3a8 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_3a8,(ulong)&local_468);
          pTVar19 = local_450;
          local_398 = local_468;
          *(undefined8 *)local_3a8 = 0x2064696c61766e49;
          *(undefined8 *)&((pointer)local_3a8)->descriptorCount = 0x7620746c75736572;
          *(undefined8 *)((long)&((pointer)local_3a8)->stageFlags + 1) = 0x7365756c61762074;
          IStack_3a0 = local_468;
          *(char *)((long)&((pointer)local_3a8)->binding + (long)local_468) = '\0';
          local_450->m_code = QP_TEST_RESULT_FAIL;
          (local_450->m_description)._M_dataplus._M_p = (pointer)&(local_450->m_description).field_2
          ;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_450->m_description,local_3a8,
                     (char *)((long)&((pointer)local_3a8)->binding + (long)local_468));
        }
        else {
          local_3a8 = (undefined1  [8])((local_470->super_TestInstance).m_context)->m_testCtx->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_3a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&IStack_3a0,"Result buffer was not written to.",0x21);
          pTVar19 = local_450;
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_3a0);
          std::ios_base::~ios_base(local_330);
          local_3a8 = (undefined1  [8])&local_398;
          local_468.bindingIndex = 0x20;
          local_468.samplerBaseIndex = 0;
          local_3a8 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_3a8,(ulong)&local_468);
          local_398 = local_468;
          ((pointer)local_3a8)->pImmutableSamplers = (VkSampler *)0x727720746f6e2073;
          *(undefined8 *)((long)local_3a8 + 0x18) = 0x6f74206e65747469;
          *(undefined8 *)local_3a8 = 0x6220746c75736552;
          *(undefined8 *)&((pointer)local_3a8)->descriptorCount = 0x6177207265666675;
          IStack_3a0 = local_468;
          *(char *)((long)&((pointer)local_3a8)->binding + (long)local_468) = '\0';
          pTVar19->m_code = QP_TEST_RESULT_FAIL;
          (pTVar19->m_description)._M_dataplus._M_p = (pointer)&(pTVar19->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar19->m_description,local_3a8,
                     (char *)((long)&((pointer)local_3a8)->binding + (long)local_468));
        }
      }
      if (local_3a8 != (undefined1  [8])&local_398) {
        operator_delete((void *)local_3a8,(long)local_398 + 1);
      }
      pVVar7 = local_458;
      if (local_428._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_428 + 8),
                   (VkPipeline)local_428._0_8_);
      }
      local_418 = (undefined1  [16])0x0;
      local_428 = (undefined1  [16])0x0;
      if (local_448 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_448 + 8),
                   (VkPipelineLayout)local_448);
      }
      if (pVVar7 != (pointer)0x0) {
        local_3a8 = (undefined1  [8])pVVar7;
        (*pDStack_3e0->_vptr_DeviceInterface[0x3d])(pDStack_3e0,local_3d8,pVStack_3d0,1);
      }
      if (local_3c8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&DStack_3c0,local_3c8);
      }
      if (local_408 != (ImmutableSamplerInfo)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_400,(VkDescriptorSetLayout)local_408);
      }
      return pTVar19;
    }
  } while( true );
}

Assistant:

tcu::TestStatus TexelBufferComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}